

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void SetActorAngle(AActor *activator,int tid,int angle,bool interpolate)

{
  AActor *this;
  FActorIterator iterator;
  DAngle local_38;
  DAngle local_30;
  FActorIterator local_28;
  
  if (tid == 0) {
    if (activator != (AActor *)0x0) {
      local_30.Degrees = (double)angle * 0.0054931640625;
      AActor::SetAngle(activator,&local_30,interpolate);
    }
  }
  else {
    local_28.base = (AActor *)0x0;
    local_28.id = tid;
    while( true ) {
      this = FActorIterator::Next(&local_28);
      if (this == (AActor *)0x0) break;
      local_38.Degrees = (double)angle * 0.0054931640625;
      AActor::SetAngle(this,&local_38,interpolate);
    }
  }
  return;
}

Assistant:

inline DAngle ACSToAngle(int acsval)
{
	return acsval * (360. / 65536.);
}